

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

ARMVAParameters aa64_va_parameters_arm(CPUARMState *env,uint64_t va,ARMMMUIdx mmu_idx,_Bool data)

{
  uint64_t value;
  int start;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  TCR *pTVar6;
  uint64_t uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool local_3e;
  bool local_3d;
  uint local_3c;
  uint32_t local_38;
  
  pTVar6 = regime_tcr(env,mmu_idx);
  value = pTVar6->raw_tcr;
  uVar3 = (uint32_t)value;
  if ((mmu_idx < 0x23) && ((0x703ef0000U >> ((ulong)mmu_idx & 0x3f) & 1) != 0)) {
    uVar7 = extract64(va,0x37,1);
    uVar8 = (uint)uVar7;
    if (uVar8 == 0) {
      uVar8 = 0;
      local_38 = extract32(uVar3,0,6);
      uVar2 = extract32(uVar3,7,1);
      uVar1 = extract32(uVar3,0xe,1);
      local_3d = uVar1 != 0;
      uVar3 = extract32(uVar3,0xf,1);
      local_3e = uVar3 != 0;
      start = 0x29;
    }
    else {
      uVar1 = extract32(uVar3,0x1e,2);
      local_3e = uVar1 == 1;
      local_3d = uVar1 == 3;
      local_38 = extract32(uVar3,0x10,6);
      uVar2 = extract32(uVar3,0x17,1);
      start = 0x2a;
    }
    local_3c = (uint)(uVar2 != 0);
    uVar7 = extract64(value,start,1);
    bVar10 = uVar7 != 0;
  }
  else {
    local_38 = extract32(uVar3,0,6);
    uVar1 = extract32(uVar3,0xe,1);
    local_3d = uVar1 != 0;
    uVar1 = extract32(uVar3,0xf,1);
    local_3e = uVar1 != 0;
    if (mmu_idx == ARMMMUIdx_Stage2) {
      bVar10 = false;
    }
    else {
      uVar3 = extract32(uVar3,0x18,1);
      bVar10 = uVar3 != 0;
    }
    local_3c = 0;
    uVar8 = 0;
  }
  uVar4 = aa64_va_parameter_tbi(value,mmu_idx);
  if (!data) {
    uVar5 = aa64_va_parameter_tbid(value,mmu_idx);
    uVar4 = uVar4 & ~uVar5;
  }
  uVar5 = 0x27;
  if (local_38 < 0x27) {
    uVar5 = local_38;
  }
  uVar9 = 0x10;
  if (0x10 < uVar5) {
    uVar9 = uVar5;
  }
  return (ARMVAParameters)
         ((uint)local_3d << 0xd | (uint)local_3e << 0xc | (uint)bVar10 << 0xb | local_3c << 10 |
          (uVar8 & 1) << 8 | (uint)((uVar4 >> (uVar8 & 0x1f) & 1) != 0) << 9 | uVar9);
}

Assistant:

ARMVAParameters aa64_va_parameters(CPUARMState *env, uint64_t va,
                                   ARMMMUIdx mmu_idx, bool data)
{
    uint64_t tcr = regime_tcr(env, mmu_idx)->raw_tcr;
    bool epd, hpd, using16k, using64k;
    int select, tsz, tbi;

    if (!regime_has_2_ranges(mmu_idx)) {
        select = 0;
        tsz = extract32(tcr, 0, 6);
        using64k = extract32(tcr, 14, 1);
        using16k = extract32(tcr, 15, 1);
        if (mmu_idx == ARMMMUIdx_Stage2) {
            /* VTCR_EL2 */
            hpd = false;
        } else {
            hpd = extract32(tcr, 24, 1);
        }
        epd = false;
    } else {
        /*
         * Bit 55 is always between the two regions, and is canonical for
         * determining if address tagging is enabled.
         */
        select = extract64(va, 55, 1);
        if (!select) {
            tsz = extract32(tcr, 0, 6);
            epd = extract32(tcr, 7, 1);
            using64k = extract32(tcr, 14, 1);
            using16k = extract32(tcr, 15, 1);
            hpd = extract64(tcr, 41, 1);
        } else {
            int tg = extract32(tcr, 30, 2);
            using16k = tg == 1;
            using64k = tg == 3;
            tsz = extract32(tcr, 16, 6);
            epd = extract32(tcr, 23, 1);
            hpd = extract64(tcr, 42, 1);
        }
    }
    tsz = MIN(tsz, 39);  /* TODO: ARMv8.4-TTST */
    tsz = MAX(tsz, 16);  /* TODO: ARMv8.2-LVA  */

    /* Present TBI as a composite with TBID.  */
    tbi = aa64_va_parameter_tbi(tcr, mmu_idx);
    if (!data) {
        tbi &= ~aa64_va_parameter_tbid(tcr, mmu_idx);
    }
    tbi = (tbi >> select) & 1;

    return (ARMVAParameters) {
        .tsz = tsz,
        .select = select,
        .tbi = tbi,
        .epd = epd,
        .hpd = hpd,
        .using16k = using16k,
        .using64k = using64k,
    };
}